

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall
camp::EnumValueNotFound::EnumValueNotFound(EnumValueNotFound *this,EnumValueNotFound *param_1)

{
  EnumValueNotFound *param_1_local;
  EnumValueNotFound *this_local;
  
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__EnumValueNotFound_001fd4a8;
  return;
}

Assistant:

class CAMP_API EnumValueNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param value Value of the requested metaenum member
     * \param enumName Name of the owner metaenum
     */
    EnumValueNotFound(long value, const std::string& enumName);
}